

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::DerefInc(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *self,SQObjectPtr *key,
              SQObjectPtr *incr,bool postfix,SQInteger selfidx)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQObjectPtr tkey;
  SQObjectPtr tself;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  local_60.super_SQObject._type = OT_NULL;
  local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_40.super_SQObject._type = (self->super_SQObject)._type;
  local_40.super_SQObject._unVal = (SQObjectValue)(self->super_SQObject)._unVal.pTable;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_50.super_SQObject._type = (key->super_SQObject)._type;
  local_50.super_SQObject._unVal = (SQObjectValue)(key->super_SQObject)._unVal.pTable;
  if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  bVar2 = Get(this,&local_40,&local_50,&local_60,0,selfidx);
  if (bVar2) {
    bVar2 = ARITH_OP(this,op,target,&local_60,incr);
    if (bVar2) {
      bVar2 = Set(this,&local_40,&local_50,target,selfidx);
      if (bVar2 && postfix) {
        bVar2 = true;
        SQObjectPtr::operator=(target,&local_60);
      }
      goto LAB_00129cc5;
    }
  }
  bVar2 = false;
LAB_00129cc5:
  SQObjectPtr::~SQObjectPtr(&local_50);
  SQObjectPtr::~SQObjectPtr(&local_40);
  SQObjectPtr::~SQObjectPtr(&local_60);
  return bVar2;
}

Assistant:

bool SQVM::DerefInc(SQInteger op,SQObjectPtr &target, SQObjectPtr &self, SQObjectPtr &key, SQObjectPtr &incr, bool postfix,SQInteger selfidx)
{
    SQObjectPtr tmp, tself = self, tkey = key;
    if (!Get(tself, tkey, tmp, 0, selfidx)) { return false; }
    _RET_ON_FAIL(ARITH_OP( op , target, tmp, incr))
    if (!Set(tself, tkey, target,selfidx)) { return false; }
    if (postfix) target = tmp;
    return true;
}